

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_egads.c
# Opt level: O1

REF_BOOL ref_egads_allows_effective(void)

{
  return 0;
}

Assistant:

REF_FCN REF_BOOL ref_egads_allows_effective(void) {
#if defined(HAVE_EGADS) && defined(HAVE_EGADS_EFFECTIVE) && \
    !defined(HAVE_EGADS_LITE)
  return REF_TRUE;
#else
  return REF_FALSE;
#endif
}